

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

void __thiscall
nitro::options::parser::parser(parser *this,string *app_name,string *about,string *group)

{
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  tuple<const_char_(&)[10]> local_48;
  tuple<nitro::options::parser_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_40;
  
  (this->app_name_)._M_dataplus._M_p = (pointer)&(this->app_name_).field_2;
  pcVar2 = (app_name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar2,pcVar2 + app_name->_M_string_length);
  (this->about_)._M_dataplus._M_p = (pointer)&(this->about_).field_2;
  pcVar2 = (about->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->about_,pcVar2,pcVar2 + about->_M_string_length);
  p_Var1 = &(this->groups_)._M_t._M_impl.super__Rb_tree_header;
  (this->groups_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->groups_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->groups_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->groups_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->groups_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->group_order_).
  super__Vector_base<nitro::options::group_*,_std::allocator<nitro::options::group_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->group_order_).
  super__Vector_base<nitro::options::group_*,_std::allocator<nitro::options::group_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->group_order_).
  super__Vector_base<nitro::options::group_*,_std::allocator<nitro::options::group_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->group_order_).
           super__Vector_base<nitro::options::group_*,_std::allocator<nitro::options::group_*>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
  *(undefined8 *)((long)&this->allowed_positionals_ + 1) = 0;
  (this->positional_name_)._M_dataplus._M_p = (pointer)&(this->positional_name_).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->positional_name_,"args","");
  local_48.super__Tuple_impl<0UL,_const_char_(&)[10]>.
  super__Head_base<0UL,_const_char_(&)[10],_false>._M_head_impl =
       (_Tuple_impl<0UL,_const_char_(&)[10]>)(_Head_base<0UL,_const_char_(&)[10],_false>)0x12acdd;
  local_40.
  super__Tuple_impl<0UL,_nitro::options::parser_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  .
  super__Tuple_impl<1UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  .
  super__Head_base<1UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_false>
  ._M_head_impl =
       (_Head_base<1UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_false>
        )(_Head_base<1UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_false>
          )group;
  local_40.
  super__Tuple_impl<0UL,_nitro::options::parser_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  .super__Head_base<0UL,_nitro::options::parser_&,_false>._M_head_impl = this;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nitro::options::group>,std::_Select1st<std::pair<std::__cxx11::string_const,nitro::options::group>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,nitro::options::group>>>
  ::
  _M_emplace_unique<std::piecewise_construct_t_const&,std::tuple<char_const(&)[10]>,std::tuple<nitro::options::parser&,std::__cxx11::string_const&>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nitro::options::group>,std::_Select1st<std::pair<std::__cxx11::string_const,nitro::options::group>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,nitro::options::group>>>
              *)&this->groups_,(piecewise_construct_t *)&std::piecewise_construct,&local_48,
             &local_40);
  return;
}

Assistant:

parser::parser(const std::string& app_name, const std::string& about, const std::string& group)
    : app_name_(app_name), about_(about)
    {
        groups_.emplace(std::piecewise_construct, std::forward_as_tuple("__default"),
                        std::forward_as_tuple(*this, group));
    }